

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.hpp
# Opt level: O2

void bits::write_int(uint32_t **word,uint32_t x,uint8_t *offset,uint8_t len)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint32_t *puVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  
  uVar7 = (uint)CONCAT71(in_register_00000009,len);
  uVar5 = x & *(uint *)(lo_set + (ulong)(uVar7 & 0x3f) * 4);
  bVar6 = *offset;
  if (bVar6 + uVar7 < 0x20) {
    puVar3 = *word;
    uVar7 = (-1 << (bVar6 + uVar7 & 0x1f) | *(uint *)(lo_set + (ulong)bVar6 * 4)) & *puVar3;
    *puVar3 = uVar7;
    *puVar3 = uVar5 << (*offset & 0x1f) | uVar7;
    *offset = *offset + len;
    return;
  }
  puVar3 = *word;
  uVar1 = *puVar3;
  uVar2 = *(uint *)(lo_set + (ulong)bVar6 * 4);
  *puVar3 = uVar1 & uVar2;
  *puVar3 = uVar5 << (*offset & 0x1f) | uVar1 & uVar2;
  if (0x20 < (byte)(*offset + len)) {
    bVar6 = *offset + len & 0x1f;
    *offset = bVar6;
    puVar4 = *word;
    uVar1 = *(uint *)(lo_set + (ulong)bVar6 * 4);
    *word = puVar4 + 1;
    uVar2 = puVar4[1];
    puVar4[1] = ~uVar1 & uVar2;
    puVar4[1] = uVar5 >> (uVar7 - *offset & 0x1f) | ~uVar1 & uVar2;
    return;
  }
  *offset = '\0';
  *word = *word + 1;
  return;
}

Assistant:

inline void write_int(
    uint32_t*& word, uint32_t x, uint8_t& offset, const uint8_t len)
{
    x &= lo_set[len & 63];
    if (offset + len < 32) {
        *word &= ((all_set << (offset + len))
            | lo_set[offset]); // mask 1..10..01..1
        *word |= (x << offset);
        offset += len;
    } else {
        *word &= ((lo_set[offset])); // mask 0....01..1
        *word |= (x << offset);
        if ((offset = (offset + len)) > 32) { // offset+len >= 32
            offset &= 31;
            *(++word) &= (~lo_set[offset]); // mask 1...10..0
            *word |= (x >> (len - offset));
        } else {
            offset = 0;
            ++word;
        }
    }
}